

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void stack_init(lua_State *L1,lua_State *L)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 *puVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  lVar5 = 0;
  puVar4 = (undefined4 *)lj_mem_realloc(L,(void *)0x0,0,0x168);
  (L1->stack).ptr32 = (uint32_t)puVar4;
  L1->stacksize = 0x2d;
  (L1->maxstack).ptr32 = (uint32_t)puVar4 + 0x138;
  L1->top = (TValue *)(puVar4 + 2);
  L1->base = (TValue *)(puVar4 + 2);
  *puVar4 = (int)L1;
  puVar4[1] = 0xfffffff9;
  auVar3 = _DAT_00155c60;
  auVar2 = _DAT_00155c50;
  auVar1 = _DAT_00155c40;
  do {
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7 = (auVar6 | auVar2) ^ auVar3;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7fffffd3) {
      puVar4[lVar5 * 2 + 1] = 0xffffffff;
      puVar4[lVar5 * 2 + 3] = 0xffffffff;
    }
    auVar6 = (auVar6 | auVar1) ^ auVar3;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7fffffd3) {
      puVar4[lVar5 * 2 + 5] = 0xffffffff;
      puVar4[lVar5 * 2 + 7] = 0xffffffff;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x30);
  return;
}

Assistant:

static void stack_init(lua_State *L1, lua_State *L)
{
  TValue *stend, *st = lj_mem_newvec(L, LJ_STACK_START+LJ_STACK_EXTRA, TValue);
  setmref(L1->stack, st);
  L1->stacksize = LJ_STACK_START + LJ_STACK_EXTRA;
  stend = st + L1->stacksize;
  setmref(L1->maxstack, stend - LJ_STACK_EXTRA - 1);
  L1->base = L1->top = st+1;
  setthreadV(L1, st, L1);  /* Needed for curr_funcisL() on empty stack. */
  while (st < stend)  /* Clear new slots. */
    setnilV(st++);
}